

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O1

void __thiscall RandStrAltList::generate(RandStrAltList *this,wchar_t **dst)

{
  uint32_t uVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  RandStrNode *pRVar8;
  bool bVar9;
  
  uVar1 = rng_next();
  uVar4 = (uint)this->altCount >> 0x10;
  uVar7 = this->altCount & 0xffff;
  uVar3 = (uVar1 >> 0x10) * uVar7;
  uVar5 = uVar4 * (uVar1 & 0xffff);
  lVar2 = (ulong)(((uVar1 & 0xffff) * uVar7 >> 0x10) + (uVar3 & 0xffff) + (uVar5 & 0xffff) >> 0x10)
          + (ulong)(uVar5 >> 0x10) + (ulong)(uVar3 >> 0x10) + (ulong)uVar4 * (ulong)(uVar1 >> 0x10);
  pRVar8 = (this->super_RandStrNode).firstChild;
  bVar9 = pRVar8 != (RandStrNode *)0x0;
  if (lVar2 != 0 && bVar9) {
    iVar6 = -(int)lVar2;
    do {
      iVar6 = iVar6 + 1;
      pRVar8 = pRVar8->nextSibling;
      bVar9 = pRVar8 != (RandStrNode *)0x0;
      if (iVar6 == 0) break;
    } while (pRVar8 != (RandStrNode *)0x0);
  }
  if (bVar9) {
    (*pRVar8->_vptr_RandStrNode[3])(pRVar8,dst);
    return;
  }
  return;
}

Assistant:

virtual void generate(VMG_ wchar_t *&dst)
    {
        /* pick one of our alternatives at random */
        int n = rand_range(rng_next(vmg0_), altCount);

        /* find it and generate it */
        RandStrNode *chi;
        for (chi = firstChild ; n != 0 && chi != 0 ;
             --n, chi = chi->nextSibling) ;

        /* generate the expression */
        if (chi != 0)
            chi->generate(vmg_ dst);
    }